

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O0

Gia_Man_t * Gia_ManTransformFlops(Gia_Man_t *p,Vec_Int_t *vFlops,Vec_Int_t *vInit)

{
  int iVar1;
  int iVar2;
  Vec_Bit_t *p_00;
  int *pInitState;
  Gia_Man_t *pGVar3;
  bool bVar4;
  int local_3c;
  int iFlopId;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Bit_t *vInitNew;
  Vec_Int_t *vInit_local;
  Vec_Int_t *vFlops_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vInit);
  iVar2 = Vec_IntSize(vFlops);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vInit) == Vec_IntSize(vFlops)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                  ,0x15a,"Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManRegNum(p);
  p_00 = Vec_BitStart(iVar1);
  local_3c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vFlops);
    bVar4 = false;
    if (local_3c < iVar1) {
      iVar1 = Vec_IntEntry(vFlops,local_3c);
      _iFlopId = Gia_ManObj(p,iVar1);
      bVar4 = _iFlopId != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsRo(p,_iFlopId);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                    ,0x15e,"Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Vec_IntEntry(vInit,local_3c);
    if (iVar1 != 0) {
      iVar2 = Gia_ObjCioId(_iFlopId);
      iVar1 = Gia_ManPiNum(p);
      iVar2 = iVar2 - iVar1;
      if ((iVar2 < 0) || (iVar1 = Gia_ManRegNum(p), iVar1 <= iVar2)) {
        __assert_fail("iFlopId >= 0 && iFlopId < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                      ,0x162,
                      "Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      Vec_BitWriteEntry(p_00,iVar2,1);
    }
    local_3c = local_3c + 1;
  }
  pInitState = Vec_BitArray(p_00);
  pGVar3 = Gia_ManDupFlip(p,pInitState);
  Vec_BitFree(p_00);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManTransformFlops( Gia_Man_t * p, Vec_Int_t * vFlops, Vec_Int_t * vInit )
{
    Vec_Bit_t * vInitNew;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, iFlopId;
    assert( Vec_IntSize(vInit) == Vec_IntSize(vFlops) );
    vInitNew = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
    {
        assert( Gia_ObjIsRo(p, pObj) );
        if ( Vec_IntEntry(vInit, i) == 0 )
            continue;
        iFlopId = Gia_ObjCioId(pObj) - Gia_ManPiNum(p);
        assert( iFlopId >= 0 && iFlopId < Gia_ManRegNum(p) );
        Vec_BitWriteEntry( vInitNew, iFlopId, 1 );
    }
    pNew = Gia_ManDupFlip( p, Vec_BitArray(vInitNew) );
    Vec_BitFree( vInitNew );
    return pNew;
}